

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::SharedCtor
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this)

{
  this->evaluationindex_ = 0;
  this->evaluationvalue_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::SharedCtor() {
  ::memset(&evaluationindex_, 0, reinterpret_cast<char*>(&evaluationvalue_) -
    reinterpret_cast<char*>(&evaluationindex_) + sizeof(evaluationvalue_));
  _cached_size_ = 0;
}